

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

DebuggerScope * __thiscall
Js::FunctionBody::GetDiagCatchScopeObjectAt(FunctionBody *this,int byteCodeOffset)

{
  int iVar1;
  DebuggerScope *this_00;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  int iVar7;
  DebuggerScope *local_40;
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr != (ScopeObjectChain *)0x0) {
    this_01 = (((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr;
    iVar7 = (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
            count;
    bVar2 = 0 < iVar7;
    if (0 < iVar7) {
      iVar7 = 0;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pTVar6 = JsUtil::
                 List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_01,iVar7);
        this_00 = pTVar6->ptr;
        if (this_00 == (DebuggerScope *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x152d,"(debuggerScope)","debuggerScope");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
        }
        if ((this_00->scopeType - DiagCatchScopeDirect < 3) &&
           (bVar4 = DebuggerScope::IsOffsetInScope(this_00,byteCodeOffset), bVar4)) {
          bVar4 = false;
          local_40 = this_00;
        }
        else {
          bVar4 = true;
        }
        if (!bVar4) break;
        iVar7 = iVar7 + 1;
        this_01 = (((this->m_sourceInfo).pScopeObjectChain.ptr)->pScopeChain).ptr;
        iVar1 = (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                ).count;
        bVar2 = iVar7 < iVar1;
      } while (iVar7 < iVar1);
    }
    if (bVar2) {
      return local_40;
    }
  }
  return (DebuggerScope *)0x0;
}

Assistant:

Js::DebuggerScope * FunctionBody::GetDiagCatchScopeObjectAt(int byteCodeOffset)
    {
        if (GetScopeObjectChain())
        {
            for (int i = 0; i < GetScopeObjectChain()->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope *debuggerScope = GetScopeObjectChain()->pScopeChain->Item(i);
                Assert(debuggerScope);

                if (debuggerScope->IsCatchScope() && debuggerScope->IsOffsetInScope(byteCodeOffset))
                {
                    return debuggerScope;
                }
            }
        }
        return nullptr;
    }